

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubDHash::Dump(ON_SubDHash *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_SubDHashType OVar2;
  uint uVar3;
  uint uVar4;
  wchar_t *pwVar5;
  ON_SHA1_Hash local_dc;
  undefined1 local_c8 [8];
  ON_wString fsha1;
  undefined1 local_a8 [8];
  ON_wString esha1;
  undefined1 local_88 [8];
  ON_wString vsha1;
  ON_TextLogIndent indent2;
  undefined1 local_58 [8];
  ON_wString subdsha1;
  uint fcount;
  uint ecount;
  undefined1 local_30 [4];
  uint vcount;
  ON_TextLogIndent indent1;
  bool bIsNotEmpty;
  ON_TextLog *text_log_local;
  ON_SubDHash *this_local;
  
  bVar1 = ON_TextLog::IsTextHash(text_log);
  if (!bVar1) {
    indent1._15_1_ = IsNotEmpty(this);
    if ((bool)indent1._15_1_) {
      OVar2 = HashType(this);
      if (OVar2 == TopologyAndEdgeCreases) {
        ON_TextLog::Print(text_log,"SubD toplogy and edge creases hash:\n");
      }
      else if (OVar2 == Geometry) {
        ON_TextLog::Print(text_log,"SubD geometry hash:\n");
      }
      else if (OVar2 == Topology) {
        ON_TextLog::Print(text_log,"SubD toplogy hash:\n");
      }
      else {
        indent1._15_1_ = 0;
      }
    }
    if ((indent1._15_1_ & 1) == 0) {
      ON_TextLog::Print(text_log,"SubD hash: Empty\n");
    }
    else {
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_30,text_log);
      uVar3 = VertexCount(this);
      uVar4 = EdgeCount(this);
      subdsha1.m_s._4_4_ = FaceCount(this);
      SubDHash((ON_SHA1_Hash *)&indent2.field_0xc,this);
      ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)local_58,(bool)((char)&indent2 + '\f'));
      pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_58);
      ON_TextLog::Print(text_log,L"SubD SHA1 = %ls\n",pwVar5);
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&vsha1,text_log);
      if (uVar3 == 0) {
        ON_TextLog::Print(text_log,"No vertices.\n");
      }
      else {
        VertexHash((ON_SHA1_Hash *)((long)&esha1.m_s + 4),this);
        ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)local_88,(bool)((char)&esha1 + '\x04'));
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_88);
        ON_TextLog::Print(text_log,L"%u vertices. SHA1 = %ls\n",(ulong)uVar3,pwVar5);
        ON_wString::~ON_wString((ON_wString *)local_88);
      }
      if (uVar4 == 0) {
        ON_TextLog::Print(text_log,"No edges.\n");
      }
      else {
        EdgeHash((ON_SHA1_Hash *)((long)&fsha1.m_s + 4),this);
        ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)local_a8,(bool)((char)&fsha1 + '\x04'));
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_a8);
        ON_TextLog::Print(text_log,L"%u edges. SHA1 = %ls\n",(ulong)uVar4,pwVar5);
        ON_wString::~ON_wString((ON_wString *)local_a8);
      }
      if (subdsha1.m_s._4_4_ == 0) {
        ON_TextLog::Print(text_log,"No faces.\n");
      }
      else {
        FaceHash(&local_dc,this);
        ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)local_c8,SUB81(&local_dc,0));
        uVar3 = subdsha1.m_s._4_4_;
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_c8);
        ON_TextLog::Print(text_log,L"%u faces. SHA1 = %ls\n",(ulong)uVar3,pwVar5);
        ON_wString::~ON_wString((ON_wString *)local_c8);
      }
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&vsha1);
      ON_wString::~ON_wString((ON_wString *)local_58);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_30);
    }
  }
  return;
}

Assistant:

void ON_SubDHash::Dump(ON_TextLog& text_log) const
{
  if (text_log.IsTextHash())
    return; 

  bool bIsNotEmpty = IsNotEmpty();

  if (bIsNotEmpty)
  {
    switch (this->HashType())
    {
    case ON_SubDHashType::Topology:
      text_log.Print("SubD toplogy hash:\n");
      break;
    case ON_SubDHashType::TopologyAndEdgeCreases:
      text_log.Print("SubD toplogy and edge creases hash:\n");
      break;
    case ON_SubDHashType::Geometry:
      text_log.Print("SubD geometry hash:\n");
      break;
    default:
      bIsNotEmpty = false;
      break;
    }
  }

  if (bIsNotEmpty)
  {
    const ON_TextLogIndent indent1(text_log);
    const unsigned vcount = this->VertexCount();
    const unsigned ecount = this->EdgeCount();
    const unsigned fcount = this->FaceCount();
    const ON_wString subdsha1 = this->SubDHash().ToStringEx(true);
    text_log.Print(L"SubD SHA1 = %ls\n", static_cast<const wchar_t*>(subdsha1));
    const ON_TextLogIndent indent2(text_log);
    if (vcount > 0)
    {
      const ON_wString vsha1 = this->VertexHash().ToStringEx(true);
      text_log.Print(L"%u vertices. SHA1 = %ls\n", vcount, static_cast<const wchar_t*>(vsha1));
    }
    else
      text_log.Print("No vertices.\n");

    if (ecount > 0)
    {
      const ON_wString esha1 = this->EdgeHash().ToStringEx(true);
      text_log.Print(L"%u edges. SHA1 = %ls\n", ecount, static_cast<const wchar_t*>(esha1));
    }
    else
      text_log.Print("No edges.\n");

    if (fcount > 0)
    {
      const ON_wString fsha1 = this->FaceHash().ToStringEx(true);
      text_log.Print(L"%u faces. SHA1 = %ls\n", fcount, static_cast<const wchar_t*>(fsha1));
    }
    else
      text_log.Print("No faces.\n");
  }
  else
    text_log.Print("SubD hash: Empty\n");
}